

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

size_t google::protobuf::internal::SerialArena::FreeStringBlocks
                 (StringBlock *string_block,size_t unused_bytes)

{
  StringBlock *pSVar1;
  StringBlock *pSVar2;
  Nonnull<const_char_*> pcVar3;
  StringBlock *unaff_RBX;
  StringBlock *__range3;
  ulong uVar4;
  ulong unaff_R12;
  long lVar5;
  StringBlock *pSVar6;
  size_t unaff_R14;
  long *plVar7;
  long *plVar8;
  size_t sVar9;
  StringBlock *unaff_R15;
  
  if (string_block == (StringBlock *)0x0) {
    FreeStringBlocks((SerialArena *)&stack0xffffffffffffffc8);
    uVar4 = unused_bytes;
  }
  else {
    unaff_RBX = string_block->next_;
    unaff_R12 = (ulong)string_block->allocated_size_;
    uVar4 = unaff_R12 - 0x10;
    unaff_R14 = unused_bytes;
    unaff_R15 = string_block;
    if (unused_bytes <= unaff_R12 - 0x10) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
      goto LAB_00ef91d3;
    }
  }
  pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                     (unaff_R14,uVar4,"offset <= effective_size()");
LAB_00ef91d3:
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((long)&unaff_R15[1].next_ + unaff_R14 != (long)&unaff_R15->next_ + unaff_R12) {
      lVar5 = (unaff_R12 - unaff_R14) + -0x10;
      plVar8 = (long *)((long)&unaff_R15->next_ + unaff_R14);
      do {
        plVar7 = plVar8 + 4;
        if (plVar7 != (long *)plVar8[2]) {
          operator_delete((long *)plVar8[2],*plVar7 + 1);
        }
        lVar5 = lVar5 + -0x20;
        plVar8 = plVar7;
      } while (lVar5 != 0);
    }
    if (unaff_R15->heap_allocated_ == true) {
      sVar9 = (size_t)unaff_R15->allocated_size_;
      operator_delete(unaff_R15,sVar9);
    }
    else {
      sVar9 = 0;
    }
    while (unaff_RBX != (StringBlock *)0x0) {
      pSVar1 = unaff_RBX->next_;
      if ((ulong)unaff_RBX->allocated_size_ != 0x10) {
        lVar5 = (ulong)unaff_RBX->allocated_size_ - 0x10;
        pSVar2 = unaff_RBX;
        do {
          pSVar6 = pSVar2 + 2;
          if (pSVar6 != pSVar2[1].next_) {
            operator_delete(pSVar2[1].next_,(ulong)((long)&pSVar6->next_->next_ + 1));
          }
          lVar5 = lVar5 + -0x20;
          pSVar2 = pSVar6;
        } while (lVar5 != 0);
      }
      if (unaff_RBX->heap_allocated_ == true) {
        uVar4 = (ulong)unaff_RBX->allocated_size_;
        operator_delete(unaff_RBX,uVar4);
      }
      else {
        uVar4 = 0;
      }
      sVar9 = sVar9 + uVar4;
      unaff_RBX = pSVar1;
    }
    return sVar9;
  }
  FreeStringBlocks();
}

Assistant:

size_t SerialArena::FreeStringBlocks(StringBlock* string_block,
                                     size_t unused_bytes) {
  ABSL_DCHECK(string_block != nullptr);
  StringBlock* next = string_block->next();
  absl::PrefetchToLocalCacheNta(next);
  std::string* end = string_block->end();
  for (std::string* s = string_block->AtOffset(unused_bytes); s != end; ++s) {
    s->~basic_string();
  }
  size_t deallocated = StringBlock::Delete(string_block);

  while ((string_block = next) != nullptr) {
    next = string_block->next();
    absl::PrefetchToLocalCacheNta(next);
    for (std::string& s : *string_block) {
      s.~basic_string();
    }
    deallocated += StringBlock::Delete(string_block);
  }
  return deallocated;
}